

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3443.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementShellANCF_3443::SetMidsurfaceOffset
          (ChElementShellANCF_3443 *this,double offset)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  this->m_midsurfoffset = offset;
  lVar1 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_cols * (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_rows;
  lVar2 = (this->m_O1).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols * (this->m_O1).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows;
  lVar3 = lVar2 + lVar1;
  if (lVar3 == 0 || SCARRY8(lVar2,lVar1) != lVar3 < 0) {
    return;
  }
  PrecomputeInternalForceMatricesWeights(this);
  return;
}

Assistant:

void ChElementShellANCF_3443::SetMidsurfaceOffset(const double offset) {
    m_midsurfoffset = offset;

    // Check to see if SetupInitial has already been called (i.e. at least one set of precomputed matrices has been
    // populated).  If so, the precomputed matrices will need to be re-generated.  If not, this will be handled once
    // SetupInitial is called.
    if (m_SD.size() + m_O1.size() > 0) {
        PrecomputeInternalForceMatricesWeights();
    }
}